

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  uint *puVar1;
  Type_Conversions *pTVar2;
  long lVar3;
  long lVar4;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar5;
  Param_Types param_types;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  captures;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sStack_f8;
  int local_e4;
  Param_Types local_e0;
  anon_class_104_5_1c3e7cb6_for_m_f_conflict local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_58;
  
  local_c0.engine._M_data = (Dispatch_Engine *)t_ss;
  const::{lambda()#1}::operator()[abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)&local_58,&local_c0);
  pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
  lVar3 = *(long *)((long)&(pTVar2->m_mutex)._M_impl._M_rwlock + 8);
  lVar4 = *(long *)(lVar3 + 0x58);
  lVar3 = *(long *)(lVar3 + 0x50);
  Arg_List_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::get_arg_types
            (&local_e0,
             *(AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> **)
              ((long)&(pTVar2->m_mutex)._M_impl._M_rwlock + 8),in_RDX);
  local_c0.engine._M_data = (in_RDX->m_engine)._M_data;
  local_c0.lambda_node.
  super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)t_ss[4].m_stack_holder._M_data;
  local_c0.lambda_node.
  super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss[4].m_conversions.m_conversions._M_data;
  if ((Type_Conversions *)
      local_c0.lambda_node.
      super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (Type_Conversions *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = &(((Type_Conversions *)
                 local_c0.lambda_node.
                 super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->m_mutex)._M_impl._M_rwlock.__data.__wrphase_futex;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = &(((Type_Conversions *)
                 local_c0.lambda_node.
                 super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->m_mutex)._M_impl._M_rwlock.__data.__wrphase_futex;
      *puVar1 = *puVar1 + 1;
    }
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0.param_names,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&t_ss[3].m_stack_holder);
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::_Rb_tree(&local_c0.captures._M_t,&local_58);
  local_c0.this_capture = *(bool *)&t_ss[4].m_engine._M_data;
  local_e4 = (int)((ulong)(lVar4 - lVar3) >> 3);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_>,chaiscript::eval::Lambda_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>const&,chaiscript::dispatch::Param_Types_const&>
            ((chaiscript *)&sStack_f8,&local_c0,&local_e4,
             (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>
              *)&t_ss[4].m_stack_holder,&local_e0);
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
            ((Object_Data *)this,&sStack_f8,false);
  if (sStack_f8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_f8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_c0.captures._M_t);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.param_names);
  if ((Type_Conversions *)
      local_c0.lambda_node.
      super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (Type_Conversions *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.lambda_node.
               super___shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Catch::clara::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_e0.m_types);
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_58);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const auto captures = [&]() -> std::map<std::string, Boxed_Value> {
          std::map<std::string, Boxed_Value> named_captures;
          for (const auto &capture : this->children[0]->children) {
            named_captures.insert(std::make_pair(capture->children[0]->text, capture->children[0]->eval(t_ss)));
          }
          return named_captures;
        }();

        const auto numparams = this->children[1]->children.size();
        const auto param_types = Arg_List_AST_Node<T>::get_arg_types(*this->children[1], t_ss);

        std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);

        return Boxed_Value(dispatch::make_dynamic_proxy_function(
            [engine, lambda_node = this->m_lambda_node, param_names = this->m_param_names, captures, this_capture = this->m_this_capture](
                const Function_Params &t_params) {
              return detail::eval_function(engine, *lambda_node, param_names, t_params, &captures, this_capture);
            },
            static_cast<int>(numparams),
            m_lambda_node,
            param_types));
      }